

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall ON_NurbsCage::SetKnot(ON_NurbsCage *this,int dir,int knot_index,double knot_value)

{
  if ((uint)dir < 3) {
    if ((-1 < knot_index && this->m_knot[(uint)dir] != (double *)0x0) &&
       (knot_index < this->m_cv_count[(uint)dir] + this->m_order[(uint)dir] + -2)) {
      this->m_knot[(uint)dir][(uint)knot_index] = knot_value;
      return true;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
             ,0x6ee,"","ON_NurbsCage::SetKnot - invalid input parameters");
  return false;
}

Assistant:

bool ON_NurbsCage::SetKnot(
      int dir,
      int knot_index,
      double knot_value
      )
{
  bool rc;

  // Validate input so invalid input does not crash Rhino.
  // Expert programmers who want to write fast code can directly
  // access the m_knot[] arrays.
  if (    dir >= 0 && dir < 3 
       && 0 != m_knot[dir]
       && knot_index >= 0 
       && knot_index < m_order[dir]+m_cv_count[dir]-2
     )
  {
    m_knot[dir][knot_index] = knot_value;
    rc = true;
  }
  else
  {
    ON_ERROR("ON_NurbsCage::SetKnot - invalid input parameters");
    rc = false;
  }
  return rc;
}